

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::EnumValBuilder::~EnumValBuilder(EnumValBuilder *this)

{
  EnumVal *this_00;
  
  this_00 = this->temp;
  if (this_00 != (EnumVal *)0x0) {
    EnumVal::~EnumVal(this_00);
  }
  operator_delete(this_00,0xa8);
  return;
}

Assistant:

~EnumValBuilder() { delete temp; }